

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::BaseAtomVisitor::setVisited(BaseAtomVisitor *this,Atom *atom)

{
  bool bVar1;
  StuntDouble *in_RSI;
  shared_ptr<OpenMD::GenericData> data;
  string *in_stack_ffffffffffffff08;
  GenericData *in_stack_ffffffffffffff10;
  StuntDouble *in_stack_ffffffffffffff18;
  shared_ptr<OpenMD::GenericData> *genData;
  StuntDouble *this_00;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined1 local_99 [72];
  allocator<char> local_51;
  string local_50 [64];
  StuntDouble *local_10;
  
  local_10 = in_RSI;
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x346404);
  __s = &local_51;
  this_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,(char *)__s,(allocator<char> *)this_00);
  StuntDouble::getPropertyByName(in_stack_ffffffffffffff18,(string *)in_stack_ffffffffffffff10);
  std::shared_ptr<OpenMD::GenericData>::operator=
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff10,
             (shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff08);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34647c);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = std::operator==((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
  if (bVar1) {
    std::make_shared<OpenMD::GenericData>();
    std::shared_ptr<OpenMD::GenericData>::operator=
              ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff10,
               (shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff08);
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x3464e8);
    std::__shared_ptr_access<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3464f2);
    genData = (shared_ptr<OpenMD::GenericData> *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,(char *)__s,(allocator<char> *)this_00);
    GenericData::setID(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
    std::shared_ptr<OpenMD::GenericData>::shared_ptr
              ((shared_ptr<OpenMD::GenericData> *)local_10,
               (shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff08);
    StuntDouble::addProperty(this_00,genData);
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x346582);
  }
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x346653);
  return;
}

Assistant:

void BaseAtomVisitor::setVisited(Atom* atom) {
    std::shared_ptr<GenericData> data;
    data = atom->getPropertyByName("VISITED");

    // if visited property is not existed, add it as new property
    if (data == nullptr) {
      data = std::make_shared<GenericData>();
      data->setID("VISITED");
      atom->addProperty(data);
    }
  }